

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JwtStrategy.cpp
# Opt level: O0

Url * __thiscall
Vault::JwtStrategy::getUrl(Url *__return_storage_ptr__,JwtStrategy *this,Client *client,Path *path)

{
  string local_48;
  Path *local_28;
  Path *path_local;
  Client *client_local;
  JwtStrategy *this_local;
  
  local_28 = path;
  path_local = (Path *)client;
  client_local = (Client *)this;
  this_local = (JwtStrategy *)__return_storage_ptr__;
  Vault::operator+(&local_48,"/v1/auth/",&this->mount_);
  (*client->_vptr_Client[3])(__return_storage_ptr__,client,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::JwtStrategy::getUrl(const Vault::Client &client,
                                      const Vault::Path &path) {
  return client.getUrl("/v1/auth/" + mount_, path);
}